

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCallOverloaded
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,SynCallArgument *argumentHead,bool allowFailure)

{
  undefined1 auVar1 [12];
  ArrayView<ArgumentData> arguments_00;
  ExprBase *pEVar2;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  SmallArray<ArgumentData,_16U> arguments;
  undefined4 uStack_34c;
  SmallArray<ArgumentData,_16U> local_348;
  
  SmallArray<ArgumentData,_16U>::SmallArray(&local_348,ctx->allocator);
  AnalyzeFunctionArgumentsEarly(ctx,argumentHead,&local_348);
  auVar1 = functions._0_12_;
  functions_00._12_4_ = 0;
  functions_00.data = (FunctionValue *)auVar1._0_8_;
  functions_00.count = auVar1._8_4_;
  AnalyzeFunctionArgumentsFinal(ctx,source,value,functions_00,argumentHead,&local_348);
  arguments_00._12_4_ = uStack_34c;
  arguments_00.count = local_348.count;
  arguments_00.data = local_348.data;
  functions_01._12_4_ = 0;
  functions_01.data = (FunctionValue *)auVar1._0_8_;
  functions_01.count = auVar1._8_4_;
  pEVar2 = CreateFunctionCallFinal(ctx,source,value,functions_01,generics,arguments_00,allowFailure)
  ;
  SmallArray<ArgumentData,_16U>::~SmallArray(&local_348);
  return pEVar2;
}

Assistant:

ExprBase* CreateFunctionCallOverloaded(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, SynCallArgument *argumentHead, bool allowFailure)
{
	SmallArray<ArgumentData, 16> arguments(ctx.allocator);
	
	AnalyzeFunctionArgumentsEarly(ctx, argumentHead, arguments);
	AnalyzeFunctionArgumentsFinal(ctx, source, value, functions, argumentHead, arguments);

	return CreateFunctionCallFinal(ctx, source, value, functions, generics, arguments, allowFailure);
}